

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateCost
          (CostAttributes *this,double time,VectorDynSize *values,double *costValue,string *label)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  element_type *peVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *pMVar10;
  string *in_RCX;
  Scalar *in_RDX;
  undefined8 in_RSI;
  CostAttributes *in_RDI;
  double in_XMM0_Qa;
  Scalar SVar11;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  VectorDynSize *desired;
  bool isValid;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffff888;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff890;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff898;
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff8a0;
  ostringstream *poVar12;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffff8a8;
  MatrixDynSize *in_stack_fffffffffffff8b8;
  dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0,_6>
  *in_stack_fffffffffffff8c0;
  StorageBaseType *in_stack_fffffffffffff8d0;
  double *in_stack_fffffffffffff8d8;
  string local_518 [32];
  ostringstream local_4f8 [376];
  string local_380 [32];
  ostringstream local_360 [376];
  undefined8 local_1e8;
  byte local_1d9;
  string local_1d8 [48];
  ostringstream local_1a8 [376];
  string *local_30;
  Scalar *local_28;
  undefined8 local_20;
  double local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = CostAttributes::isValid(in_RDI);
  if (bVar1) {
    lVar4 = iDynTree::VectorDynSize::size();
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x34d795);
    (*peVar5->_vptr_Selector[3])();
    lVar6 = iDynTree::MatrixDynSize::cols();
    if (lVar4 == lVar6) {
      peVar9 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x34d8c7);
      iVar2 = (*peVar9->_vptr_TimeVaryingObject[2])(local_18,peVar9,&local_1d9);
      local_1e8 = CONCAT44(extraout_var,iVar2);
      if ((local_1d9 & 1) == 0) {
        poVar12 = local_360;
        std::__cxx11::ostringstream::ostringstream(poVar12);
        poVar7 = std::operator<<((ostream *)poVar12,"Unable to retrieve a valid desired ");
        poVar7 = std::operator<<(poVar7,local_30);
        poVar7 = std::operator<<(poVar7," at time: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
        std::operator<<(poVar7,".");
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("L2NormCost","costEvaluation",pcVar8);
        std::__cxx11::string::~string(local_380);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_360);
      }
      else {
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34da3c);
        uVar3 = Selector::size((Selector *)0x34da44);
        other = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)(ulong)uVar3;
        pMVar10 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::VectorDynSize::size();
        if (other == pMVar10) {
          peVar5 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x34dbac);
          (*peVar5->_vptr_Selector[2])(peVar5,local_20);
          toEigen((VectorDynSize *)in_stack_fffffffffffff8a8);
          toEigen((VectorDynSize *)in_stack_fffffffffffff8a8);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>
          ::operator-((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)in_stack_fffffffffffff8b8,other);
          toEigen((VectorDynSize *)in_stack_fffffffffffff8a8);
          Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                    (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
          toEigen((VectorDynSize *)in_stack_fffffffffffff8a8);
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          transpose(in_stack_fffffffffffff898);
          Eigen::operator*(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
          toEigen(in_stack_fffffffffffff8b8);
          toEigen((VectorDynSize *)in_stack_fffffffffffff8a8);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
          operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff8a8,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff8a0);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const>>
          ::operator*(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
          SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                             (in_stack_fffffffffffff8c0);
          *local_28 = SVar11;
          local_1 = 1;
        }
        else {
          poVar12 = local_4f8;
          std::__cxx11::ostringstream::ostringstream(poVar12);
          poVar7 = std::operator<<((ostream *)poVar12,"The desired ");
          poVar7 = std::operator<<(poVar7,local_30);
          poVar7 = std::operator<<(poVar7,
                                   " dimension does not match the size of the selector at time: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
          std::operator<<(poVar7,".");
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("L2NormCost","costEvaluation",pcVar8);
          std::__cxx11::string::~string(local_518);
          local_1 = 0;
          std::__cxx11::ostringstream::~ostringstream(local_4f8);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar7 = std::operator<<((ostream *)local_1a8,"The ");
      poVar7 = std::operator<<(poVar7,local_30);
      std::operator<<(poVar7," dimension is not the one expected from the specified selector.");
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("L2NormCost","costEvaluation",pcVar8);
      std::__cxx11::string::~string(local_1d8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  else {
    *local_28 = 0.0;
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool evaluateCost(double time, const VectorDynSize& values, double& costValue, const std::string &label) {
                if (!isValid()) {
                    costValue = 0.0;
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);


                costValue = 0.5 * iDynTree::toEigen(buffer).transpose() * (iDynTree::toEigen(weightMatrix) * iDynTree::toEigen(buffer));

                return true;
            }